

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_alloc.c
# Opt level: O1

int small_is_unused_cb(void *stats,void *arg)

{
  *(ulong *)arg = *arg + (ulong)(uint)(*(int *)((long)stats + 0xc) * *(int *)((long)stats + 8));
  return 0;
}

Assistant:

static int
small_is_unused_cb(const void *stats, void *arg)
{
	const struct mempool_stats *mempool_stats =
		(const struct mempool_stats *)stats;
	unsigned long *slab_total = arg;
	*slab_total += mempool_stats->slabsize * mempool_stats->slabcount;
	(void)stats;
	(void)arg;
	return 0;
}